

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString(ScriptContext *this,PropertyRecord *propertyRecord)

{
  PropertyString *pPVar1;
  
  pPVar1 = GetProperty<Js::PropertyString>(this,propertyRecord->pid,propertyRecord);
  return pPVar1;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString(const PropertyRecord* propertyRecord)
    {
        return this->GetProperty<PropertyString>(propertyRecord->GetPropertyId(), propertyRecord);
    }